

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_val_t * mpcaf_grammar_char(mpc_val_t *x,void *s)

{
  byte bVar1;
  char cVar2;
  char *__ptr;
  mpc_parser_t *pmVar3;
  mpc_parser_t *pmVar4;
  void *pvVar5;
  void *pvVar6;
  
  __ptr = (char *)mpcf_unescape_new(x,"\a\b\f\n\r\t\v\\\'\"",mpc_escape_output_c);
  free(x);
  bVar1 = *(byte *)((long)s + 0x18);
  cVar2 = *__ptr;
  pmVar3 = (mpc_parser_t *)calloc(1,0x38);
  pmVar3->type = '\t';
  (pmVar3->data).range.x = cVar2;
  pmVar3 = mpc_expectf(pmVar3,"\'%c\'",(ulong)(uint)(int)cVar2);
  if ((bVar1 & 2) == 0) {
    pmVar4 = mpc_blank();
    pmVar3 = mpc_and(2,mpcf_fst,pmVar3,pmVar4,mpcf_dtor_null);
  }
  free(__ptr);
  pvVar5 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar5 + 0x30) = 0xf;
  *(mpc_parser_t **)((long)pvVar5 + 8) = pmVar3;
  *(code **)((long)pvVar5 + 0x10) = mpcf_str_ast;
  pvVar6 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar6 + 0x30) = 0x10;
  *(void **)((long)pvVar6 + 8) = pvVar5;
  *(code **)((long)pvVar6 + 0x10) = mpc_ast_tag;
  *(char **)((long)pvVar6 + 0x18) = "char";
  pvVar5 = calloc(1,0x38);
  *(undefined1 *)((long)pvVar5 + 0x30) = 7;
  pmVar3 = mpc_and(2,mpcf_state_ast,pvVar5,pvVar6,free);
  return pmVar3;
}

Assistant:

static mpc_val_t *mpcaf_grammar_char(mpc_val_t *x, void *s) {
  mpca_grammar_st_t *st = s;
  char *y = mpcf_unescape(x);
  mpc_parser_t *p = (st->flags & MPCA_LANG_WHITESPACE_SENSITIVE) ? mpc_char(y[0]) : mpc_tok(mpc_char(y[0]));
  free(y);
  return mpca_state(mpca_tag(mpc_apply(p, mpcf_str_ast), "char"));
}